

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool flatbuffers::operator==(Array<int,_(unsigned_short)2> *lhs,Array<int,_(unsigned_short)2> *rhs)

{
  if (lhs != rhs) {
    return *(long *)lhs->data_ == *(long *)rhs->data_;
  }
  return true;
}

Assistant:

bool operator==(const Array<T, length> &lhs,
                const Array<T, length> &rhs) noexcept {
  return std::addressof(lhs) == std::addressof(rhs) ||
         (lhs.size() == rhs.size() &&
          std::memcmp(lhs.Data(), rhs.Data(), rhs.size() * sizeof(T)) == 0);
}